

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::LogDataForFunctionBody
          (ScriptContext *this,FunctionBody *body,uint idx,bool isRejit)

{
  bool bVar1;
  Recycler *pRVar2;
  RejitStatsMap *pRVar3;
  RejitStats *this_00;
  BailoutStatsMap *this_01;
  undefined **local_60;
  RejitStats *stats;
  size_t local_50;
  char *local_48;
  DWORD local_40;
  uint local_38;
  uint local_34 [2];
  uint idx_local;
  
  pRVar3 = this->rejitStatsMap;
  local_34[0] = idx;
  if (pRVar3 == (RejitStatsMap *)0x0) {
    local_60 = &JsUtil::
                WeaklyReferencedKeyDictionary<Js::FunctionBody_const,Js::ScriptContext::RejitStats*,DefaultComparer<Js::FunctionBody_const*>,true>
                ::typeinfo;
    stats = (RejitStats *)0x0;
    local_50 = 0xffffffffffffffff;
    local_48 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
    ;
    local_40 = 0x18b4;
    pRVar2 = Memory::Recycler::TrackAllocInfo
                       (this->recycler,(TrackAllocData *)&stack0xffffffffffffffa0);
    pRVar3 = (RejitStatsMap *)new<Memory::Recycler>(0x50,pRVar2,0x37a1d4);
    pRVar2 = this->recycler;
    pRVar3->size = 0;
    pRVar3->count = 0;
    pRVar3->version = 0;
    pRVar3->freeList = 0;
    pRVar3->freeCount = 0;
    (pRVar3->buckets).ptr = (int *)0x0;
    (pRVar3->entries).ptr =
         (WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
          *)0x0;
    pRVar3->recycler = pRVar2;
    (pRVar3->entryRemovalCallback).cookie.ptr = (void *)0x0;
    pRVar3->lastWeakReferenceCleanupId = pRVar2->weakReferenceCleanupId;
    pRVar3->disableCleanup = false;
    pRVar3->modFunctionIndex = 0x4b;
    (pRVar3->entryRemovalCallback).fnCallback = (Type)0x0;
    this->rejitStatsMap = pRVar3;
    BindReference(this,pRVar3);
    pRVar3 = this->rejitStatsMap;
  }
  local_60 = (undefined **)0x0;
  bVar1 = JsUtil::
          WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
          ::TryGetValue(pRVar3,body,(RejitStats **)&stack0xffffffffffffffa0);
  if (!bVar1) {
    this_00 = (RejitStats *)new<Memory::ArenaAllocator>(0x18,&this->generalAllocator,0x35916e);
    RejitStats::RejitStats(this_00,this);
    local_60 = (undefined **)this_00;
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
    ::Item(this->rejitStatsMap,body,this_00);
  }
  if (isRejit) {
    ((RejitStats *)local_60)->m_rejitReasonCounts[idx] =
         ((RejitStats *)local_60)->m_rejitReasonCounts[idx] + 1;
  }
  else {
    bVar1 = JsUtil::
            BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(((RejitStats *)local_60)->m_bailoutReasonCounts,local_34);
    if (bVar1) {
      local_38 = JsUtil::
                 BaseDictionary<unsigned_int,_unsigned_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::Item(((RejitStats *)local_60)->m_bailoutReasonCounts,local_34);
      local_38 = local_38 + 1;
      this_01 = ((RejitStats *)local_60)->m_bailoutReasonCounts;
    }
    else {
      this_01 = ((RejitStats *)local_60)->m_bailoutReasonCounts;
      local_38 = 1;
    }
    JsUtil::
    BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Insert<(JsUtil::BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
              ((BaseDictionary<unsigned_int,unsigned_int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_01,local_34,&local_38);
  }
  return;
}

Assistant:

void ScriptContext::LogDataForFunctionBody(Js::FunctionBody *body, uint idx, bool isRejit)
    {
        if (rejitStatsMap == NULL)
        {
            rejitStatsMap = RecyclerNew(this->recycler, RejitStatsMap, this->recycler);
            BindReference(rejitStatsMap);
        }

        RejitStats *stats = NULL;
        if (!rejitStatsMap->TryGetValue(body, &stats))
        {
            stats = Anew(GeneralAllocator(), RejitStats, this);
            rejitStatsMap->Item(body, stats);
        }

        if (isRejit)
        {
            stats->m_rejitReasonCounts[idx]++;
        }
        else
        {
            if (!stats->m_bailoutReasonCounts->ContainsKey(idx))
            {
                stats->m_bailoutReasonCounts->Item(idx, 1);
            }
            else
            {
                uint val = stats->m_bailoutReasonCounts->Item(idx);
                ++val;
                stats->m_bailoutReasonCounts->Item(idx, val);
            }
        }
    }